

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isGatherCompareResultValid
               (TextureCubeView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               float cmpReference,Vec4 *result)

{
  ConstPixelBufferAccess *pCVar1;
  TextureFormat TVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  Sampler *pSVar7;
  TexComparePrecision *pTVar8;
  undefined4 coord_00;
  undefined4 coord_01;
  bool isFixedPoint;
  bool bVar9;
  CmpResultSet CVar10;
  int iVar11;
  CubeFace CVar12;
  TextureCubeView *pTVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  CubeFaceIntCoords CVar22;
  int numPossibleFaces;
  Vec2 vBounds;
  Vec2 uBounds;
  CubeFace possibleFaces [6];
  ConstPixelBufferAccess faces [6];
  bool local_1c6;
  int local_1c0;
  int local_1ac;
  TextureCubeView *local_1a8;
  int local_1a0;
  float local_19c;
  int local_198;
  CubeFaceIntCoords local_194;
  Sampler *local_188;
  TexComparePrecision *local_180;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  Vec3 *local_168;
  long local_160;
  Vec4 *local_158;
  ulong local_150;
  CubeFace local_148 [8];
  undefined1 local_128 [16];
  undefined8 auStack_118 [29];
  
  local_1ac = 0;
  local_1a8 = texture;
  local_19c = cmpReference;
  local_188 = sampler;
  local_180 = prec;
  local_168 = coord;
  local_158 = result;
  TexVerifierUtil::getPossibleCubeFaces(coord,&prec->coordBits,local_148,&local_1ac);
  if (local_1ac == 0) {
    local_1c6 = true;
  }
  else {
    local_1c6 = 0 < local_1ac;
    if (0 < local_1ac) {
      local_1a8 = (TextureCubeView *)local_1a8->m_levels;
      local_160 = 0;
      do {
        uVar15 = (ulong)local_148[local_160];
        projectToFace((tcu *)local_128,local_148[local_160],local_168);
        coord_01 = local_128._4_4_;
        coord_00 = local_128._0_4_;
        pTVar13 = local_1a8;
        isFixedPoint = isFixedPointDepthTextureFormat
                                 (&(*(ConstPixelBufferAccess **)((long)local_1a8 + uVar15 * 8))->
                                   m_format);
        pTVar8 = local_180;
        pSVar7 = local_188;
        iVar11 = ((*(ConstPixelBufferAccess **)((long)pTVar13 + uVar15 * 8))->m_size).m_data[0];
        local_150 = uVar15;
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&local_170,local_188->normalizedCoords,iVar11,(float)coord_00,
                   (local_180->coordBits).m_data[0],(local_180->uvwBits).m_data[0]);
        local_198 = iVar11;
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&local_178,pSVar7->normalizedCoords,iVar11,(float)coord_01,
                   (pTVar8->coordBits).m_data[1],(pTVar8->uvwBits).m_data[1]);
        fVar17 = local_170 + -0.5;
        fVar18 = local_16c + -0.5;
        fVar19 = local_178 + -0.5;
        fVar20 = local_174 + -0.5;
        lVar14 = 0;
        do {
          ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)(local_128 + lVar14));
          lVar14 = lVar14 + 0x28;
        } while (lVar14 != 0xf0);
        fVar17 = floorf(fVar17);
        fVar19 = floorf(fVar19);
        lVar14 = 0;
        pTVar13 = local_1a8;
        do {
          pCVar1 = *(ConstPixelBufferAccess **)pTVar13;
          *(void **)(local_128 + lVar14 * 8 + 0x20) = pCVar1->m_data;
          TVar2 = pCVar1->m_format;
          uVar3 = *(undefined8 *)(pCVar1->m_size).m_data;
          uVar4 = *(undefined8 *)((pCVar1->m_pitch).m_data + 1);
          *(undefined8 *)(local_128 + lVar14 * 8 + 0x10) =
               *(undefined8 *)((pCVar1->m_size).m_data + 2);
          *(undefined8 *)(local_128 + lVar14 * 8 + 0x18) = uVar4;
          *(TextureFormat *)(local_128 + (lVar14 * 2 + -2) * 4 + 8) = TVar2;
          *(undefined8 *)(local_128 + lVar14 * 8 + 8) = uVar3;
          lVar14 = lVar14 + 5;
          pTVar13 = (TextureCubeView *)((long)pTVar13 + 8);
        } while (lVar14 != 0x1e);
        fVar18 = floorf(fVar18);
        fVar20 = floorf(fVar20);
        local_1c0 = (int)fVar19;
        local_1a0 = (int)fVar20;
        bVar9 = local_1c0 <= local_1a0;
        if (local_1c0 <= local_1a0) {
          bVar9 = true;
          iVar11 = (int)fVar17;
          do {
            for (; iVar11 <= (int)fVar18; iVar11 = iVar11 + 1) {
              if (isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
                  ::offsets == '\0') {
                isGatherCompareResultValid();
              }
              bVar16 = true;
              uVar15 = 0;
              bVar6 = true;
              do {
                local_194.s = (&isGatherCompareResultValid(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::TexComparePrecision_const&,tcu::CubeFaceCoords<float>const&,float,tcu::Vector<float,int>const&)
                                ::offsets)[uVar15 * 2] + iVar11;
                local_194.t = (&DAT_00d777d4)[uVar15 * 2] + local_1c0;
                local_194.face = (CubeFace)local_150;
                CVar22 = remapCubeEdgeCoords(&local_194,local_198);
                CVar12 = CVar22.face;
                bVar5 = bVar6;
                if ((ulong)CVar12 != 6) {
                  fVar19 = ConstPixelBufferAccess::getPixDepth
                                     ((ConstPixelBufferAccess *)(local_128 + (ulong)CVar12 * 0x28),
                                      CVar22.s,CVar22.t,0);
                  pTVar8 = local_180;
                  CVar10 = execCompare(local_188->compare,fVar19,local_19c,local_180->referenceBits,
                                       isFixedPoint);
                  fVar19 = local_158->m_data[uVar15];
                  fVar20 = TexVerifierUtil::computeFixedPointError(pTVar8->resultBits);
                  fVar21 = fVar19 - fVar20;
                  fVar19 = fVar19 + fVar20;
                  if ((((((ushort)CVar10 & 1) == 0) || (1.0 < fVar21)) || (fVar19 < 1.0)) &&
                     (bVar5 = false, ((ushort)CVar10 >> 8 & 1) != 0)) {
                    if (fVar19 < 0.0) {
                      bVar6 = false;
                    }
                    bVar5 = false;
                    if (fVar21 <= 0.0) {
                      bVar5 = bVar6;
                    }
                  }
                }
                if (CVar12 == CUBEFACE_LAST) break;
                bVar16 = uVar15 < 3;
                uVar15 = uVar15 + 1;
                bVar16 = (bool)(bVar16 & bVar5);
                bVar6 = bVar5;
              } while (bVar16);
              if ((bVar16) || (bVar5)) goto LAB_00a76cf8;
            }
            local_1c0 = local_1c0 + 1;
            bVar9 = local_1c0 <= local_1a0;
            iVar11 = (int)fVar17;
          } while (local_1c0 <= local_1a0);
        }
LAB_00a76cf8:
        if (bVar9) {
          return local_1c6;
        }
        local_160 = local_160 + 1;
        local_1c6 = local_160 < local_1ac;
      } while (local_160 < local_1ac);
    }
  }
  return local_1c6;
}

Assistant:

bool isGatherCompareResultValid (const TextureCubeView&			texture,
								 const Sampler&					sampler,
								 const TexComparePrecision&		prec,
								 const Vec3&					coord,
								 float							cmpReference,
								 const Vec4&					result)
{
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(coord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
	{
		const CubeFaceFloatCoords faceCoords(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], coord));

		if (isGatherCompareResultValid(texture, sampler, prec, faceCoords, cmpReference, result))
			return true;
	}

	return false;
}